

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall MarkdownHighlighter::iniHighlighter(MarkdownHighlighter *this,QString *text)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  qsizetype qVar5;
  QTextCharFormat *pQVar6;
  int iVar7;
  QChar local_ae;
  int local_ac;
  QChar local_a8;
  QChar local_a6;
  int findComment;
  QChar local_92;
  int local_90;
  HighlighterState local_8c;
  int equalsPos;
  QTextCharFormat format;
  HighlighterState local_70;
  QChar local_6c;
  QChar local_6a;
  int local_68;
  QColor local_64 [2];
  QChar local_42;
  int local_40;
  HighlighterState local_3c;
  int sectionEnd;
  QTextCharFormat sectionFormat;
  int i;
  qsizetype textLen;
  QString *text_local;
  MarkdownHighlighter *this_local;
  
  bVar2 = QString::isEmpty(text);
  if (!bVar2) {
    qVar5 = QString::length(text);
    for (sectionFormat._12_4_ = 0; (int)sectionFormat._12_4_ < qVar5;
        sectionFormat._12_4_ = sectionFormat._12_4_ + 1) {
      sectionFormat._10_2_ = QString::at(text,(long)(int)sectionFormat._12_4_);
      QChar::QChar((QChar *)&sectionFormat.field_0x8,'[');
      bVar2 = ::operator==((QChar)sectionFormat._10_2_,(QChar)sectionFormat._8_2_);
      iVar3 = (int)qVar5;
      iVar7 = (int)this;
      if (bVar2) {
        local_3c = CodeType;
        pQVar6 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                           (&_formats,&local_3c);
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)&sectionEnd,pQVar6);
        QChar::QChar(&local_42,']');
        local_40 = QString::indexOf((QChar *)text,(ulong)(ushort)local_42.ucs,sectionFormat._12_4_);
        if (local_40 == -1) {
          QTextCharFormat::setUnderlineStyle((UnderlineStyle)&sectionEnd);
          QColor::QColor(local_64,red);
          QTextCharFormat::setUnderlineColor((QTextCharFormat *)&sectionEnd,local_64);
          local_40 = iVar3;
        }
        local_40 = local_40 + 1;
        QSyntaxHighlighter::setFormat
                  (iVar7,sectionFormat._12_4_,
                   (QTextCharFormat *)(ulong)(uint)(local_40 - sectionFormat._12_4_));
        sectionFormat._12_4_ = local_40;
        if (local_40 < qVar5) {
          local_68 = 0;
        }
        else {
          local_68 = 2;
        }
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)&sectionEnd);
joined_r0x00138ba4:
        if (local_68 != 0) {
          return;
        }
      }
      else {
        local_6a = QString::at(text,(long)(int)sectionFormat._12_4_);
        QChar::QChar(&local_6c,';');
        bVar2 = ::operator==(local_6a,local_6c);
        uVar1 = sectionFormat._12_4_;
        if (bVar2) {
          uVar4 = iVar3 - sectionFormat._12_4_;
          local_70 = CodeComment;
          QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                    (&_formats,&local_70);
          QSyntaxHighlighter::setFormat(iVar7,uVar1,(QTextCharFormat *)(ulong)uVar4);
          return;
        }
        format._14_2_ = QString::at(text,(long)(int)sectionFormat._12_4_);
        bVar2 = QChar::isLetter((QChar *)&format.field_0xe);
        if (bVar2) {
          local_8c = CodeKeyWord;
          pQVar6 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                             (&_formats,&local_8c);
          QTextCharFormat::QTextCharFormat((QTextCharFormat *)&equalsPos,pQVar6);
          QChar::QChar(&local_92,'=');
          local_90 = QString::indexOf((QChar *)text,(ulong)(ushort)local_92.ucs,sectionFormat._12_4_
                                     );
          if (local_90 == -1) {
            QColor::QColor((QColor *)&findComment,red);
            QTextCharFormat::setUnderlineColor((QTextCharFormat *)&equalsPos,(QColor *)&findComment)
            ;
            QTextCharFormat::setUnderlineStyle((UnderlineStyle)&equalsPos);
            local_90 = iVar3;
          }
          QSyntaxHighlighter::setFormat
                    (iVar7,sectionFormat._12_4_,
                     (QTextCharFormat *)(ulong)(uint)(local_90 - sectionFormat._12_4_));
          sectionFormat._12_4_ = local_90 + -1;
          if ((int)sectionFormat._12_4_ < qVar5) {
            local_68 = 0;
          }
          else {
            local_68 = 2;
          }
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)&equalsPos);
          goto joined_r0x00138ba4;
        }
        local_a6 = QString::at(text,(long)(int)sectionFormat._12_4_);
        QChar::QChar(&local_a8,'=');
        bVar2 = ::operator==(local_a6,local_a8);
        if (bVar2) {
          QChar::QChar(&local_ae,';');
          local_ac = QString::indexOf((QChar *)text,(ulong)(ushort)local_ae.ucs,sectionFormat._12_4_
                                     );
          if (local_ac == -1) {
            return;
          }
          sectionFormat._12_4_ = local_ac + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::iniHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();

    for (int i = 0; i < textLen; ++i) {
        // start of a [section]
        if (text.at(i) == QChar('[')) {
            QTextCharFormat sectionFormat = _formats[CodeType];
            int sectionEnd = text.indexOf(QChar(']'), i);
            // if an end bracket isn't found, we apply red underline to show
            // error
            if (sectionEnd == -1) {
                sectionFormat.setUnderlineStyle(QTextCharFormat::DotLine);
                sectionFormat.setUnderlineColor(Qt::red);
                sectionEnd = textLen;
            }
            sectionEnd++;
            setFormat(i, sectionEnd - i, sectionFormat);
            i = sectionEnd;
            if (i >= textLen) break;
        }

        // comment ';'
        else if (text.at(i) == QChar(';')) {
            setFormat(i, textLen - i, _formats[CodeComment]);
            i = textLen;
            break;
        }

        // key-val
        else if (text.at(i).isLetter()) {
            QTextCharFormat format = _formats[CodeKeyWord];
            int equalsPos = text.indexOf(QChar('='), i);
            if (equalsPos == -1) {
                format.setUnderlineColor(Qt::red);
                format.setUnderlineStyle(QTextCharFormat::DotLine);
                equalsPos = textLen;
            }
            setFormat(i, equalsPos - i, format);
            i = equalsPos - 1;
            if (i >= textLen) break;
        }
        // skip everything after '=' (except comment)
        else if (text.at(i) == QChar('=')) {
            const int findComment = text.indexOf(QChar(';'), i);
            if (findComment == -1) break;
            i = findComment - 1;
        }
    }
}